

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiOldColumns *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiOldColumnData *pIVar3;
  float x_offset;
  float t;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  int column_index_local;
  
  pIVar2 = GetCurrentWindowRead();
  pIVar1 = (pIVar2->DC).CurrentColumns;
  if (pIVar1 == (ImGuiOldColumns *)0x0) {
    window._4_4_ = 0.0;
  }
  else {
    window._0_4_ = column_index;
    if (column_index < 0) {
      window._0_4_ = pIVar1->Current;
    }
    if ((pIVar1->Columns).Size <= (int)window) {
      __assert_fail("column_index < columns->Columns.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0xe58,"float ImGui::GetColumnOffset(int)");
    }
    pIVar3 = ImVector<ImGuiOldColumnData>::operator[](&pIVar1->Columns,(int)window);
    window._4_4_ = ImLerp<float>(pIVar1->OffMinX,pIVar1->OffMaxX,pIVar3->OffsetNorm);
  }
  return window._4_4_;
}

Assistant:

float ImGui::GetColumnOffset(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return 0.0f;

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const float t = columns->Columns[column_index].OffsetNorm;
    const float x_offset = ImLerp(columns->OffMinX, columns->OffMaxX, t);
    return x_offset;
}